

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O0

bool __thiscall Corrade::Utility::Configuration::save(Configuration *this,string *filename)

{
  ulong uVar1;
  Debug *debug;
  bool bVar2;
  Flags local_229;
  Error local_228;
  undefined4 local_1fc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  BasicStringView<const_char> local_1d8;
  void *local_1c8;
  size_t local_1c0;
  Path *local_1b8;
  int local_1b0;
  ostringstream local_198 [8];
  ostringstream out;
  string *filename_local;
  Configuration *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  save(this,(ostream *)local_198);
  Containers::BasicStringView<char_const>::
  BasicStringView<std::__cxx11::string_const&,Corrade::Containers::BasicStringView<char_const>>
            ((BasicStringView<char_const> *)&local_1b8,filename);
  std::__cxx11::ostringstream::str();
  Containers::BasicStringView<char_const>::
  BasicStringView<std::__cxx11::string,Corrade::Containers::BasicStringView<char_const>>
            ((BasicStringView<char_const> *)&local_1d8,&local_1f8);
  Containers::ArrayView<void_const>::
  ArrayView<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::ArrayView<char_const>>
            ((ArrayView<void_const> *)&local_1c8,&local_1d8);
  uVar1 = Path::write(local_1b8,local_1b0,local_1c8,local_1c0);
  std::__cxx11::string::~string((string *)&local_1f8);
  bVar2 = (uVar1 & 1) != 0;
  if (!bVar2) {
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_229);
    Error::Error(&local_228,local_229);
    debug = Debug::operator<<(&local_228.super_Debug,
                              "Utility::Configuration::save(): cannot open file");
    operator<<<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (debug,filename);
    Error::~Error(&local_228);
  }
  local_1fc = 1;
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return bVar2;
}

Assistant:

bool Configuration::save(const std::string& filename) {
    /* Save to a stringstream and then write it as a string to the file. Doing
       it this way to avoid issues with Unicode filenames on Windows. */
    /** @todo get rid of streams altogether, and then of the StringView cast
        also */
    std::ostringstream out;
    save(out);
    if(Path::write(filename, Containers::StringView{out.str()}))
        return true;

    Error() << "Utility::Configuration::save(): cannot open file" << filename;
    return false;
}